

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  xmlAttrPtr pxVar1;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  xmlNodePtr oldseq;
  xmlAttrPtr tmp;
  xmlAttrPtr prop;
  xmlChar *oldvalue;
  xmlChar *value;
  int i;
  int ret;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  tmp = (xmlAttrPtr)0x0;
  if (ctxt->state->nbAttrLeft < 1) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (define->name == (xmlChar *)0x0) {
      value._0_4_ = 0;
      while ((pxVar1 = tmp, (int)value < ctxt->state->nbAttrs &&
             ((pxVar1 = ctxt->state->attrs[(int)value], pxVar1 == (xmlAttrPtr)0x0 ||
              (iVar4 = xmlRelaxNGAttributeMatch(ctxt,define,pxVar1), iVar4 != 1))))) {
        value._0_4_ = (int)value + 1;
      }
      tmp = pxVar1;
      if (tmp == (xmlAttrPtr)0x0) {
        value._4_4_ = -1;
      }
      else {
        oldvalue = xmlNodeListGetString(tmp->doc,tmp->children,1);
        pxVar2 = ctxt->state->value;
        pxVar3 = ctxt->state->seq;
        ctxt->state->seq = (xmlNodePtr)tmp;
        ctxt->state->value = oldvalue;
        value._4_4_ = xmlRelaxNGValidateValueContent(ctxt,define->content);
        if (ctxt->state->value != (xmlChar *)0x0) {
          oldvalue = ctxt->state->value;
        }
        if (oldvalue != (xmlChar *)0x0) {
          (*xmlFree)(oldvalue);
        }
        ctxt->state->value = pxVar2;
        ctxt->state->seq = pxVar3;
        if (value._4_4_ == 0) {
          ctxt->state->attrs[(int)value] = (xmlAttrPtr)0x0;
          ctxt->state->nbAttrLeft = ctxt->state->nbAttrLeft + -1;
        }
      }
    }
    else {
      value._0_4_ = 0;
      while ((pxVar1 = tmp, (int)value < ctxt->state->nbAttrs &&
             (((pxVar1 = ctxt->state->attrs[(int)value], pxVar1 == (xmlAttrPtr)0x0 ||
               (iVar4 = xmlStrEqual(define->name,pxVar1->name), iVar4 == 0)) ||
              ((((define->ns != (xmlChar *)0x0 && (*define->ns != '\0')) ||
                (pxVar1->ns != (xmlNs *)0x0)) &&
               ((pxVar1->ns == (xmlNs *)0x0 ||
                (iVar4 = xmlStrEqual(define->ns,pxVar1->ns->href), iVar4 == 0))))))))) {
        value._0_4_ = (int)value + 1;
      }
      tmp = pxVar1;
      if (tmp == (xmlAttrPtr)0x0) {
        value._4_4_ = -1;
      }
      else {
        oldvalue = xmlNodeListGetString(tmp->doc,tmp->children,1);
        pxVar2 = ctxt->state->value;
        pxVar3 = ctxt->state->seq;
        ctxt->state->seq = (xmlNodePtr)tmp;
        ctxt->state->value = oldvalue;
        ctxt->state->endvalue = (xmlChar *)0x0;
        value._4_4_ = xmlRelaxNGValidateValueContent(ctxt,define->content);
        if (ctxt->state->value != (xmlChar *)0x0) {
          oldvalue = ctxt->state->value;
        }
        if (oldvalue != (xmlChar *)0x0) {
          (*xmlFree)(oldvalue);
        }
        ctxt->state->value = pxVar2;
        ctxt->state->seq = pxVar3;
        if (value._4_4_ == 0) {
          ctxt->state->attrs[(int)value] = (xmlAttrPtr)0x0;
          ctxt->state->nbAttrLeft = ctxt->state->nbAttrLeft + -1;
        }
      }
    }
    ctxt_local._4_4_ = value._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,
                            xmlRelaxNGDefinePtr define)
{
    int ret = 0, i;
    xmlChar *value, *oldvalue;
    xmlAttrPtr prop = NULL, tmp;
    xmlNodePtr oldseq;

    if (ctxt->state->nbAttrLeft <= 0)
        return (-1);
    if (define->name != NULL) {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) && (xmlStrEqual(define->name, tmp->name))) {
                if ((((define->ns == NULL) || (define->ns[0] == 0)) &&
                     (tmp->ns == NULL)) ||
                    ((tmp->ns != NULL) &&
                     (xmlStrEqual(define->ns, tmp->ns->href)))) {
                    prop = tmp;
                    break;
                }
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ctxt->state->endvalue = NULL;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
#ifdef DEBUG
        xmlGenericError(xmlGenericErrorContext,
                        "xmlRelaxNGValidateAttribute(%s): %d\n",
                        define->name, ret);
#endif
    } else {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) &&
                (xmlRelaxNGAttributeMatch(ctxt, define, tmp) == 1)) {
                prop = tmp;
                break;
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
#ifdef DEBUG
        if (define->ns != NULL) {
            xmlGenericError(xmlGenericErrorContext,
                            "xmlRelaxNGValidateAttribute(nsName ns = %s): %d\n",
                            define->ns, ret);
        } else {
            xmlGenericError(xmlGenericErrorContext,
                            "xmlRelaxNGValidateAttribute(anyName): %d\n",
                            ret);
        }
#endif
    }

    return (ret);
}